

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

uint32_t __thiscall cfd::core::Psbt::AddTxOut(Psbt *this,Script *locking_script,Amount *amount)

{
  uint32_t index;
  wally_psbt *psbt;
  uint64_t satoshi;
  CfdException *pCVar1;
  int ret;
  wally_tx_output *output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script;
  int local_94;
  wally_tx_output *local_90;
  Transaction local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  psbt = (wally_psbt *)this->wally_psbt_pointer_;
  index = (uint32_t)psbt->num_outputs;
  Script::GetData((ByteData *)&local_88,locking_script);
  ByteData::GetBytes(&local_48,(ByteData *)&local_88);
  if (local_88.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
    operator_delete(local_88.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  local_90 = (wally_tx_output *)0x0;
  satoshi = Amount::GetSatoshiValue(amount);
  local_94 = wally_tx_output_init_alloc
                       (satoshi,local_48.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,&local_90);
  if (local_94 == 0) {
    local_94 = wally_psbt_add_output_at(psbt,index,0,local_90);
    wally_tx_output_free(local_90);
    if (local_94 == 0) {
      RebuildTransaction(&local_88,this->wally_psbt_pointer_);
      Transaction::operator=(&this->base_tx_,&local_88);
      Transaction::~Transaction(&local_88);
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return index;
    }
    local_88.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x59b33e;
    local_88.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xb59;
    local_88.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x599be6;
    logger::log<int&>((CfdSourceLocation *)&local_88,kCfdLogLevelWarning,
                      "wally_psbt_add_output_at NG[{}]",&local_94);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&local_88.vin_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"psbt add output error.","");
    CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)&local_88);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_88.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x59b33e;
  local_88.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xb52;
  local_88.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x599be6;
  logger::log<int&>((CfdSourceLocation *)&local_88,kCfdLogLevelWarning,
                    "wally_tx_output_init_alloc NG[{}]",&local_94);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  local_88.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&local_88.vin_;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"psbt alloc output error.","");
  CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)&local_88);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Psbt::AddTxOut(const Script &locking_script, const Amount &amount) {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  uint32_t index = static_cast<uint32_t>(psbt_pointer->num_outputs);
  auto script = locking_script.GetData().GetBytes();
  struct wally_tx_output *output = nullptr;

  int ret = wally_tx_output_init_alloc(
      static_cast<uint64_t>(amount.GetSatoshiValue()), script.data(),
      script.size(), &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_output_init_alloc NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt alloc output error.");
  }

  ret = wally_psbt_add_output_at(psbt_pointer, index, 0, output);
  wally_tx_output_free(output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_add_output_at NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt add output error.");
  }
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
  return index;
}